

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FboTestUtil::Texture2DShader::shadeFragments
          (Texture2DShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  pointer pUVar2;
  Texture2D *this_00;
  GenericVec4 *pGVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  Vec4 *a;
  int fragNdx;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint local_160;
  Vec4 coord;
  Vec4 bias;
  Vec4 scale;
  Vec2 texCoords [4];
  Vec4 outBias;
  Vec4 outScale;
  Vec4 colors [4];
  tcu local_50 [16];
  tcu local_40 [16];
  
  tcu::Vector<float,_4>::Vector
            (&outScale,
             (float (*) [4])
             &((this->super_ShaderProgram).m_uniforms.
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start)->value);
  tcu::Vector<float,_4>::Vector
            (&outBias,(float (*) [4])
                      &(this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].value);
  texCoords[2].m_data[0] = 0.0;
  texCoords[2].m_data[1] = 0.0;
  texCoords[3].m_data[0] = 0.0;
  texCoords[3].m_data[1] = 0.0;
  texCoords[0].m_data[0] = 0.0;
  texCoords[0].m_data[1] = 0.0;
  texCoords[1].m_data[0] = 0.0;
  texCoords[1].m_data[1] = 0.0;
  lVar6 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)colors[0].m_data + lVar6));
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  uVar4 = 0;
  uVar8 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar8 = uVar4;
  }
  do {
    if (uVar4 == uVar8) {
      return;
    }
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      rr::readTriangleVarying<float>((rr *)&coord,packets + uVar4,context,0,(int)lVar6);
      *(ulong *)texCoords[lVar6].m_data = CONCAT44(coord.m_data[1],coord.m_data[0]);
    }
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
      tcu::Vector<float,_4>::Vector(&coord,0.0);
      *(float *)((long)colors[0].m_data + lVar6) = coord.m_data[0];
      *(float *)((long)colors[0].m_data + lVar6 + 4) = coord.m_data[1];
      *(float *)((long)colors[0].m_data + lVar6 + 8) = coord.m_data[2];
      *(float *)((long)colors[0].m_data + lVar6 + 0xc) = coord.m_data[3];
    }
    lVar6 = 0;
    while( true ) {
      if ((int)(((long)(this->m_inputs).
                       super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_inputs).
                      super__Vector_base<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x24) <= lVar6) break;
      iVar5 = (int)lVar6;
      pUVar2 = (this->super_ShaderProgram).m_uniforms.
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = pUVar2[iVar5 * 3 + 2].sampler.tex2D;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&scale,(float (*) [4])&pUVar2[iVar5 * 3 + 3].value);
      tcu::Vector<float,_4>::Vector
                (&bias,(float (*) [4])
                       &(this->super_ShaderProgram).m_uniforms.
                        super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar5 * 3 + 4].value);
      lVar9 = 0;
      do {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)coord.m_data + lVar9));
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x40);
      sglr::rc::Texture2D::sample4(this_00,&coord,texCoords,0.0);
      for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 0x10) {
        tcu::operator*(local_50,(Vector<float,_4> *)((long)coord.m_data + lVar9),
                       (Vector<float,_4> *)&scale);
        tcu::operator+(local_40,(Vector<float,_4> *)local_50,&bias);
        tcu::Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)((long)colors[0].m_data + lVar9),(Vector<float,_4> *)local_40
                  );
      }
      lVar6 = lVar6 + 1;
    }
    local_160 = (int)uVar4 * 4;
    a = colors;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      tcu::operator*((tcu *)&scale,a,&outScale);
      tcu::operator+((tcu *)&coord,(Vector<float,_4> *)&scale,&outBias);
      castVectorSaturate<int>(&coord);
      castVectorSaturate<unsigned_int>(&coord);
      DVar1 = this->m_outputType;
      uVar7 = (uint)lVar6;
      if (DVar1 == TYPE_UINT_VEC4) {
        pGVar3 = context->outputArray;
        iVar5 = (uVar7 | local_160) * context->numFragmentOutputs;
        fVar10 = bias.m_data[0];
        fVar11 = bias.m_data[1];
        fVar12 = bias.m_data[2];
        fVar13 = bias.m_data[3];
LAB_01295b92:
        pGVar3 = pGVar3 + iVar5;
        (pGVar3->v).fData[0] = fVar10;
        (pGVar3->v).fData[1] = fVar11;
        (pGVar3->v).fData[2] = fVar12;
        (pGVar3->v).fData[3] = fVar13;
      }
      else {
        if (DVar1 == TYPE_INT_VEC4) {
          pGVar3 = context->outputArray;
          iVar5 = (uVar7 | local_160) * context->numFragmentOutputs;
          fVar10 = scale.m_data[0];
          fVar11 = scale.m_data[1];
          fVar12 = scale.m_data[2];
          fVar13 = scale.m_data[3];
          goto LAB_01295b92;
        }
        if (DVar1 == TYPE_FLOAT_VEC4) {
          pGVar3 = context->outputArray;
          iVar5 = (uVar7 | local_160) * context->numFragmentOutputs;
          pGVar3[iVar5].v.fData[0] = coord.m_data[0];
          pGVar3[iVar5].v.fData[1] = coord.m_data[1];
          pGVar3[iVar5].v.fData[2] = coord.m_data[2];
          pGVar3[iVar5].v.fData[3] = coord.m_data[3];
        }
      }
      a = a + 1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void Texture2DShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 outScale (m_uniforms[0].value.f4);
	const tcu::Vec4 outBias	 (m_uniforms[1].value.f4);

	tcu::Vec2 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		// setup tex coords
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec2(coord.x(), coord.y());
		}

		// clear result
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			colors[fragNdx] = tcu::Vec4(0.0f);

		// sample each texture
		for (int ndx = 0; ndx < (int)m_inputs.size(); ndx++)
		{
			const sglr::rc::Texture2D*	tex		= m_uniforms[2 + ndx*3].sampler.tex2D;
			const tcu::Vec4				scale	(m_uniforms[2 + ndx*3 + 1].value.f4);
			const tcu::Vec4				bias	(m_uniforms[2 + ndx*3 + 2].value.f4);
			tcu::Vec4 tmpColors[4];

			tex->sample4(tmpColors, texCoords);

			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				colors[fragNdx] += tmpColors[fragNdx] * scale + bias;
		}

		// write out
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * outScale + outBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}